

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Joint::removeJoint(Joint *this,Scene *scene)

{
  Joint *pJVar1;
  Joint **ppJVar2;
  Skeleton *pSVar3;
  __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
  _Var4;
  pointer ppJVar5;
  pointer ppJVar6;
  Skeleton *local_28;
  
  local_28 = this->skeleton;
  if (local_28->root != this) {
    ppJVar5 = (this->kids).
              super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppJVar6 = (this->kids).
                   super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppJVar6 != ppJVar5;
        ppJVar6 = ppJVar6 + 1) {
      removeJoint(*ppJVar6,scene);
    }
    Scene::removeObject(scene,&this->super_SceneObject);
    pJVar1 = this->parent;
    local_28 = (Skeleton *)this;
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,__gnu_cxx::__ops::_Iter_equals_val<CMU462::DynamicScene::Joint*const>>
                      ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pJVar1->kids).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pJVar1->kids).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_equals_val<CMU462::DynamicScene::Joint_*const>)&local_28);
    ppJVar2 = (pJVar1->kids).
              super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var4._M_current != ppJVar2) &&
       (ppJVar6 = (pJVar1->kids).
                  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
       ppJVar5 = (pointer)((long)_Var4._M_current + ((long)ppJVar6 - (long)ppJVar2)),
       ppJVar6 != ppJVar5)) {
      (pJVar1->kids).
      super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppJVar5;
    }
    pSVar3 = this->skeleton;
    local_28 = (Skeleton *)this;
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<CMU462::DynamicScene::Joint**,std::vector<CMU462::DynamicScene::Joint*,std::allocator<CMU462::DynamicScene::Joint*>>>,__gnu_cxx::__ops::_Iter_equals_val<CMU462::DynamicScene::Joint*const>>
                      ((__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pSVar3->joints).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        )(pSVar3->joints).
                         super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_equals_val<CMU462::DynamicScene::Joint_*const>)&local_28);
    ppJVar2 = (pSVar3->joints).
              super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var4._M_current != ppJVar2) &&
       (ppJVar6 = (pSVar3->joints).
                  super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
       ppJVar5 = (pointer)((long)_Var4._M_current + ((long)ppJVar6 - (long)ppJVar2)),
       ppJVar6 != ppJVar5)) {
      (pSVar3->joints).
      super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppJVar5;
    }
    (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00266948;
    ppJVar6 = (this->kids).
              super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppJVar6 != (pointer)0x0) {
      operator_delete(ppJVar6,(long)(this->kids).
                                    super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppJVar6);
    }
    (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR___cxa_pure_virtual_00266720;
    std::
    _Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
                 *)&(this->super_SceneObject).scales);
    std::
    _Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
                 *)&(this->super_SceneObject).rotations);
    std::
    _Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
    ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_CMU462::Vector3D>,_std::_Select1st<std::pair<const_double,_CMU462::Vector3D>_>,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
                 *)&(this->super_SceneObject).positions);
    operator_delete(this,0x160);
  }
  return;
}

Assistant:

void Joint::removeJoint(Scene* scene)
   {
     if (this == skeleton->root)
       return;

     for (auto childJoint : kids)
     {
       childJoint->removeJoint(scene);
     }

     scene->removeObject(this);

     auto & kids = parent->kids;
     kids.erase(std::remove(kids.begin(), kids.end(), this), kids.end());

     auto & joints = skeleton->joints;
     joints.erase(std::remove(joints.begin(), joints.end(), this), joints.end());

     delete this;
   }